

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

void Block4Stream_Close(TBlockStream *pStream)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  void *__ptr;
  DWORD i;
  ulong uVar8;
  undefined4 *puVar9;
  
  puVar9 = (undefined4 *)pStream->FileBitmap;
  if (puVar9 == (undefined4 *)0x0) {
    __ptr = (void *)0x0;
  }
  else {
    for (uVar8 = 0; uVar8 < pStream->BitmapSize; uVar8 = uVar8 + 1) {
      (pStream->super_TFileStream).Base.Http.hConnect = *(HANDLE *)(puVar9 + 8);
      uVar1 = *puVar9;
      uVar2 = puVar9[1];
      uVar3 = puVar9[2];
      uVar4 = puVar9[3];
      uVar5 = puVar9[5];
      uVar6 = puVar9[6];
      uVar7 = puVar9[7];
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x10) = puVar9[4];
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x14) = uVar5;
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x18) = uVar6;
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0x1c) = uVar7;
      *(undefined4 *)&(pStream->super_TFileStream).Base = uVar1;
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 4) = uVar2;
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 8) = uVar3;
      *(undefined4 *)((long)&(pStream->super_TFileStream).Base + 0xc) = uVar4;
      (*(pStream->super_TFileStream).BaseClose)(&pStream->super_TFileStream);
      puVar9 = puVar9 + 10;
    }
    __ptr = pStream->FileBitmap;
  }
  free(__ptr);
  pStream->FileBitmap = (void *)0x0;
  return;
}

Assistant:

static void Block4Stream_Close(TBlockStream * pStream)
{
    TBaseProviderData * BaseArray = (TBaseProviderData *)pStream->FileBitmap;

    // If we have a non-zero count of base streams,
    // we have to close them all
    if(BaseArray != NULL)
    {
        // Close all base streams
        for(DWORD i = 0; i < pStream->BitmapSize; i++)
        {
            memcpy(&pStream->Base, BaseArray + i, sizeof(TBaseProviderData));
            pStream->BaseClose(pStream);
        }
    }

    // Free the data map, if any
    if(pStream->FileBitmap != NULL)
        CASC_FREE(pStream->FileBitmap);
    pStream->FileBitmap = NULL;

    // Do not call the BaseClose function,
    // we closed all handles already
    return;
}